

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

word Sbd_ManSolve(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivSet,Vec_Int_t *vDivVars,
                 Vec_Int_t *vDivValues,Vec_Int_t *vTemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  ulong local_d8;
  int local_70;
  int nIter;
  int pLits [2];
  int *pFinal;
  int nFinal;
  int iVar;
  int i;
  int status;
  word uTruth;
  word uCube;
  int nBTLimit;
  Vec_Int_t *vDivValues_local;
  Vec_Int_t *vDivVars_local;
  Vec_Int_t *vDivSet_local;
  int FreeVar_local;
  int PivotVar_local;
  sat_solver *pSat_local;
  
  _i = 0;
  iVar1 = sat_solver_nvars(pSat);
  if (iVar1 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0xb7,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_IntSize(vDivVars);
  iVar2 = Vec_IntSize(vDivValues);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0xb8,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_70 = Abc_Var2Lit(PivotVar,0);
  nIter = Abc_Var2Lit(FreeVar,0);
  do {
    iVar1 = sat_solver_solve(pSat,&local_70,pLits,0,0,0,0);
    if (iVar1 == 0) {
      return 0x1234567812345678;
    }
    if (iVar1 == -1) {
      return _i;
    }
    if (iVar1 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,0xc3,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (nFinal = 0; iVar1 = Vec_IntSize(vDivVars), nFinal < iVar1; nFinal = nFinal + 1) {
      iVar1 = Vec_IntEntry(vDivVars,nFinal);
      iVar1 = sat_solver_var_value(pSat,iVar1);
      Vec_IntWriteEntry(vDivValues,nFinal,iVar1 << 1);
    }
    Vec_IntClear(vTemp);
    iVar1 = Abc_LitNot(local_70);
    Vec_IntPush(vTemp,iVar1);
    for (nFinal = 0; iVar1 = Vec_IntSize(vDivSet), nFinal < iVar1; nFinal = nFinal + 1) {
      iVar1 = Vec_IntEntry(vDivSet,nFinal);
      iVar1 = sat_solver_var_literal(pSat,iVar1);
      Vec_IntPush(vTemp,iVar1);
    }
    piVar4 = Vec_IntArray(vTemp);
    piVar5 = Vec_IntArray(vTemp);
    iVar1 = Vec_IntSize(vTemp);
    iVar1 = sat_solver_solve(pSat,piVar4,piVar5 + iVar1,0,0,0,0);
    if (iVar1 == 0) {
      return 0x1234567812345678;
    }
    if (iVar1 == 1) {
      for (nFinal = 0; iVar1 = Vec_IntSize(vDivVars), nFinal < iVar1; nFinal = nFinal + 1) {
        iVar1 = Vec_IntEntry(vDivVars,nFinal);
        iVar1 = sat_solver_var_value(pSat,iVar1);
        Vec_IntAddToEntry(vDivValues,nFinal,iVar1);
      }
      for (nFinal = 0; iVar1 = Vec_IntSize(vDivValues), nFinal < iVar1; nFinal = nFinal + 1) {
        Vec_IntAddToEntry(vDivValues,nFinal,0xc);
      }
      return 0x8765432187654321;
    }
    if (iVar1 != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,0xd2,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = sat_solver_final(pSat,(int **)pLits);
    uTruth = 0xffffffffffffffff;
    Vec_IntClear(vTemp);
    iVar2 = Abc_LitNot(nIter);
    Vec_IntPush(vTemp,iVar2);
    for (nFinal = 0; nFinal < iVar1; nFinal = nFinal + 1) {
      if (*(int *)((long)pLits + (long)nFinal * 4) != local_70) {
        Vec_IntPush(vTemp,*(int *)((long)pLits + (long)nFinal * 4));
        iVar2 = Abc_Lit2Var(*(int *)((long)pLits + (long)nFinal * 4));
        iVar2 = Vec_IntFind(vDivSet,iVar2);
        if (iVar2 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,0xdd,
                        "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar3 = Abc_LitIsCompl(*(int *)((long)pLits + (long)nFinal * 4));
        if (iVar3 == 0) {
          local_d8 = s_Truths6[iVar2] ^ 0xffffffffffffffff;
        }
        else {
          local_d8 = s_Truths6[iVar2];
        }
        uTruth = local_d8 & uTruth;
      }
    }
    _i = uTruth | _i;
    piVar4 = Vec_IntArray(vTemp);
    piVar5 = Vec_IntArray(vTemp);
    iVar1 = Vec_IntSize(vTemp);
    iVar1 = sat_solver_addclause(pSat,piVar4,piVar5 + iVar1);
  } while (iVar1 != 0);
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                ,0xe2,
                "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

word Sbd_ManSolve( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivSet, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vTemp )
{
    int nBTLimit = 0;
    word uCube, uTruth = 0;
    int status, i, iVar, nFinal, * pFinal, pLits[2], nIter = 0;
    assert( FreeVar < sat_solver_nvars(pSat) );
    assert( Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues) );
    pLits[0] = Abc_Var2Lit( PivotVar, 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntForEachEntry( vDivVars, iVar, i )
            Vec_IntWriteEntry( vDivValues, i, 2*sat_solver_var_value(pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vDivSet, iVar, i )
            Vec_IntPush( vTemp, sat_solver_var_literal(pSat, iVar) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vTemp, pFinal[i] );
            iVar = Vec_IntFind( vDivSet, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntAddToEntry( vDivValues, i, sat_solver_var_value(pSat, iVar) );

    for ( i = 0; i < Vec_IntSize(vDivValues); i++ )
        Vec_IntAddToEntry( vDivValues, i, 0xC );
/*
    // reduce the counter example
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_Var2Lit(PivotVar, n) ); // n = 0 => F = 1  (expanding offset against onset)
        for ( i = 0; i < Vec_IntSize(vValues); i++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(i, !((Vec_IntEntry(vValues, i) >> n) & 1)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        for ( i = 0; i < nFinal; i++ )
            if ( Abc_Lit2Var(pFinal[i]) != PivotVar )
                Vec_IntAddToEntry( vValues, Abc_Lit2Var(pFinal[i]), 1 << (n+2) );
    }
*/
    return SBD_SAT_SAT;
}